

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.hxx
# Opt level: O2

string * msg_if_given_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char msg [2048];
  undefined8 local_8d8;
  void **local_8d0;
  undefined1 *local_8c8;
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  undefined8 local_818;
  char acStack_809 [2049];
  
  if (in_AL != '\0') {
    local_888 = in_XMM0_Qa;
    local_878 = in_XMM1_Qa;
    local_868 = in_XMM2_Qa;
    local_858 = in_XMM3_Qa;
    local_848 = in_XMM4_Qa;
    local_838 = in_XMM5_Qa;
    local_828 = in_XMM6_Qa;
    local_818 = in_XMM7_Qa;
  }
  local_8a8 = in_RDX;
  local_8a0 = in_RCX;
  local_898 = in_R8;
  local_890 = in_R9;
  if (*format == '\0') {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)((long)acStack_809 + 1));
  }
  else {
    local_8c8 = local_8b8;
    local_8d0 = &args[0].overflow_arg_area;
    local_8d8 = 0x3000000010;
    iVar1 = vsnprintf((char *)((long)acStack_809 + 1),0x800,format,&local_8d8);
    lVar2 = (long)iVar1;
    lVar3 = lVar2;
    if (acStack_809[lVar2] == '\n') {
      lVar3 = lVar2 + -1;
      acStack_809[lVar2] = '\0';
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,(long)acStack_809 + 1,(long)acStack_809 + lVar3 + 1U
              );
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string msg_if_given
                          ( const char* format,
                            ... ) {
#endif
    if (format[0] == 0x0) {
        return "";
    } else {
        _fix_format(format);
        size_t len = 0;
        char msg[2048];
        va_list args;
        va_start(args, format);
        len = vsnprintf(msg, 2048, format, args);
        va_end(args);

        // Get rid of newline at the end.
        if (msg[len-1] == '\n') {
            len--;
            msg[len] = 0x0;
        }
        return std::string(msg, len);
    }
}